

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::BufferStorage::GetBufferParameterTest::GetBufferParameterTest
          (GetBufferParameterTest *this,Context *context)

{
  vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  *this_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined8 unaff_RBP;
  long lVar4;
  testCase local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  GetBufferParameterTest *local_48;
  long local_40;
  long local_38;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"get_buffer_parameter",
             "Test queries for parameters of buffers");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetBufferParameterTest_020c3500;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_64 = 0x20c3501;
  local_48 = this;
  do {
    local_68 = ((byte)~(byte)local_64 & 1) << 8;
    unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    do {
      local_70.m_flags = ((byte)~(byte)unaff_RBP & 1) << 9 | local_68;
      local_68 = local_70.m_flags;
      if (local_70.m_flags != 0) {
        local_70.m_access = 0;
        std::
        vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
        ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_70);
      }
      local_50 = 4;
      lVar3 = 0;
      local_60 = (uint)unaff_RBP;
      do {
        local_5c = GetBufferParameterTest::s_mapping_bits[lVar3] | local_68;
        local_54 = local_5c | 1;
        local_58 = local_5c | 2;
        local_5c = local_5c | 3;
        lVar4 = 0;
        local_40 = lVar3;
        do {
          uVar1 = *(uint *)((long)GetBufferParameterTest::s_mapping_bits + lVar4);
          local_70.m_flags = local_54;
          local_70.m_access = uVar1 | 1;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_70)
          ;
          local_70.m_flags = local_58;
          local_70.m_access = uVar1 | 2;
          local_38 = lVar4;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_70)
          ;
          uVar2 = local_5c;
          local_70.m_flags = local_5c;
          local_70.m_access = uVar1 | 1;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_70)
          ;
          local_70.m_flags = uVar2;
          local_70.m_access = uVar1 | 2;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_70)
          ;
          local_70.m_access = uVar1 | 3;
          local_70.m_flags = uVar2;
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::emplace_back<gl4cts::BufferStorage::GetBufferParameterTest::testCase>(this_00,&local_70)
          ;
          lVar4 = local_38 + 4;
        } while (local_50 != lVar4);
        lVar3 = local_40 + 1;
        local_50 = local_50 + 4;
      } while (lVar3 != 3);
      unaff_RBP = 0;
    } while ((local_60 & 1) != 0);
    uVar1 = local_64 & 1;
    local_64 = 0;
  } while (uVar1 != 0);
  return;
}

Assistant:

GetBufferParameterTest::GetBufferParameterTest(deqp::Context& context)
	: TestCase(context, "get_buffer_parameter", "Test queries for parameters of buffers")
{
	static const GLenum s_mapping_bits[] = { 0, GL_MAP_PERSISTENT_BIT, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT };
	static const GLuint s_n_mapping_bits = sizeof(s_mapping_bits) / sizeof(s_mapping_bits[0]);

	GLenum flags = 0;

	for (GLuint dynamic = 0; dynamic < 2; ++dynamic)
	{
		flags = (0 == dynamic) ? 0 : GL_DYNAMIC_STORAGE_BIT;

		for (GLuint client = 0; client < 2; ++client)
		{
			flags |= (0 == client) ? 0 : GL_CLIENT_STORAGE_BIT;

			/* No "map" bits */
			if (0 != flags)
			{
				m_test_cases.push_back(testCase(flags, 0));
			}

			for (GLuint flag_idx = 0; flag_idx < s_n_mapping_bits; ++flag_idx)
			{
				const GLenum flag_mapping_bits  = s_mapping_bits[flag_idx];
				const GLenum flags_with_mapping = flags | flag_mapping_bits;

				for (GLuint access_idx = 0; access_idx <= flag_idx; ++access_idx)
				{
					const GLenum access = s_mapping_bits[access_idx];

					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_READ_BIT, access | GL_MAP_READ_BIT));
					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_WRITE_BIT, access | GL_MAP_WRITE_BIT));
					m_test_cases.push_back(
						testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, access | GL_MAP_READ_BIT));
					m_test_cases.push_back(
						testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, access | GL_MAP_WRITE_BIT));
					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT,
													access | GL_MAP_WRITE_BIT | GL_MAP_READ_BIT));
				}
			}
		}
	}
}